

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O2

void amrex::Copy<amrex::BaseFab<int>,void>
               (FabArray<amrex::BaseFab<int>_> *dst,FabArray<amrex::BaseFab<int>_> *src,int srccomp,
               int dstcomp,int numcomp,IntVect *nghost)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  Box local_19c;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  FabArray<amrex::BaseFab<int>_> *local_168;
  FabArray<amrex::BaseFab<int>_> *local_160;
  IntVect *local_158;
  long local_150;
  long local_148;
  ulong local_140;
  long local_138;
  long local_130;
  ulong local_128;
  ulong local_120;
  Array4<int> dstFab;
  Array4<const_int> srcFab;
  MFIter mfi;
  
  uVar4 = (ulong)(uint)numcomp;
  local_168 = dst;
  local_160 = src;
  local_158 = nghost;
  MFIter::MFIter(&mfi,&dst->super_FabArrayBase,true);
  local_148 = (long)dstcomp;
  if (numcomp < 1) {
    uVar4 = 0;
  }
  local_150 = (long)srccomp;
  local_140 = uVar4;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox(&local_19c,&mfi,local_158);
    if ((((local_19c.smallend.vect[0] <= local_19c.bigend.vect[0]) &&
         (local_19c.smallend.vect[1] <= local_19c.bigend.vect[1])) &&
        (local_19c.smallend.vect[2] <= local_19c.bigend.vect[2])) && (local_19c.btype.itype < 8)) {
      FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>(&srcFab,local_160,&mfi);
      FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>(&dstFab,local_168,&mfi);
      local_170 = local_19c.smallend.vect[0];
      local_17c = local_19c.smallend.vect[1];
      local_180 = local_19c.smallend.vect[2];
      local_120 = (ulong)(uint)local_19c.bigend.vect[0];
      local_16c = local_19c.bigend.vect[1];
      local_178 = local_19c.bigend.vect[2];
      uVar4 = 0;
      while (uVar3 = uVar4, uVar3 != local_140) {
        local_130 = local_150 + uVar3;
        local_138 = local_148 + uVar3;
        iVar5 = local_19c.smallend.vect[2];
        while (iVar1 = iVar5, iVar1 <= local_19c.bigend.vect[2]) {
          for (iVar5 = local_19c.smallend.vect[1]; iVar5 <= local_19c.bigend.vect[1];
              iVar5 = iVar5 + 1) {
            iVar2 = local_19c.smallend.vect[0];
            if (local_19c.smallend.vect[0] <= local_19c.bigend.vect[0]) {
              do {
                dstFab.p[((long)iVar5 - (long)dstFab.begin.y) * dstFab.jstride +
                         (long)(iVar2 - dstFab.begin.x) +
                         ((long)iVar1 - (long)dstFab.begin.z) * dstFab.kstride +
                         dstFab.nstride * local_138] =
                     srcFab.p[((long)iVar5 - (long)srcFab.begin.y) * srcFab.jstride +
                              (long)(iVar2 - srcFab.begin.x) +
                              ((long)iVar1 - (long)srcFab.begin.z) * srcFab.kstride +
                              srcFab.nstride * local_130];
                iVar2 = iVar2 + 1;
              } while (local_19c.bigend.vect[0] + 1U != iVar2);
            }
          }
          local_174 = iVar1;
          iVar5 = iVar1 + 1;
        }
        local_128 = uVar3;
        uVar4 = uVar3 + 1;
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
Copy (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& srcarr = src.const_arrays();
        auto const& dstarr = dst.arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstarr[box_no](i,j,k,dstcomp+n) = srcarr[box_no](i,j,k,srccomp+n);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,dstcomp+n) = srcFab(i,j,k,srccomp+n);
                });
            }
        }
    }
}